

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O3

string * iconv_convert_abi_cxx11_(string *__return_storage_ptr__,char *src,size_t len,iconv_t conv)

{
  size_t sVar1;
  int *piVar2;
  string *extraout_RAX;
  char *bufptr;
  size_t outlen;
  char buffer [512];
  char *local_278;
  _Alloc_hider local_270;
  string *local_268;
  char local_260;
  undefined7 uStack_25f;
  undefined8 uStack_258;
  size_t local_250;
  size_t local_248;
  char *local_240;
  char local_238 [520];
  
  local_270._M_p = &local_260;
  local_268 = (string *)0x0;
  local_260 = '\0';
  local_248 = len;
  local_240 = src;
  do {
    local_250 = 0x200;
    local_278 = local_238;
    sVar1 = iconv(conv,&local_240,&local_248,&local_278,&local_250);
    std::__cxx11::string::replace((ulong)&local_270,(ulong)local_268,(char *)0x0,(ulong)local_238);
    if (sVar1 != 0xffffffffffffffff) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (local_270._M_p == &local_260) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_25f,local_260);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_258;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_270._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_25f,local_260);
      }
      __return_storage_ptr__->_M_string_length = (size_type)local_268;
      return local_268;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 7);
  iconv_convert_abi_cxx11_();
  return extraout_RAX;
}

Assistant:

static std::string iconv_convert(const char* src, size_t len, iconv_t conv) {
	std::string out;
	char buffer[512];
	size_t res;
	do {
		char* bufptr = buffer;
		size_t outlen = sizeof(buffer);
		res = iconv(conv, const_cast<char**>(&src), &len, &bufptr, &outlen);
		out.append(buffer, bufptr);
	} while (res == (size_t)-1 && errno == E2BIG);
	if (res == -1) {
		perror("Failed string encoding conversion:");
		return std::string();
	}
	return out;
}